

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void save_cdef_boundary_lines
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int plane,int row,int stripe,int use_highbd
               ,int is_above,RestorationStripeBoundaries *boundaries)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int extend;
  uint8_t *buf;
  uint8_t *__src;
  long lVar4;
  byte bVar5;
  int in_ECX;
  int in_EDX;
  AV1_COMMON *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  long *in_stack_00000010;
  int i;
  int line_bytes;
  int upscaled_width;
  int ss_x;
  int src_width;
  uint8_t *bdry_rows;
  int bdry_stride;
  uint8_t *bdry_start;
  uint8_t *bdry_buf;
  uint8_t *src_rows;
  int src_stride;
  uint8_t *src_buf;
  int is_uv;
  int in_stack_ffffffffffffff6c;
  uint3 in_stack_ffffffffffffff74;
  uint stride;
  byte bVar6;
  long lVar7;
  int local_74;
  
  uVar1 = (uint)(0 < in_EDX);
  if (in_R9D == 0) {
    buf = *(uint8_t **)(in_RDI + 0x28 + (long)in_EDX * 8);
  }
  else {
    buf = (uint8_t *)(*(long *)(in_RDI + 0x28 + (long)in_EDX * 8) << 1);
  }
  bVar5 = (byte)in_R9D;
  __src = buf + (long)in_ECX *
                (long)(*(int *)(in_RDI + 0x20 + (long)(int)uVar1 * 4) << (bVar5 & 0x1f));
  if (in_stack_00000008 == 0) {
    lVar7 = in_stack_00000010[1];
  }
  else {
    lVar7 = *in_stack_00000010;
  }
  lVar4 = lVar7 + (4 << (bVar5 & 0x1f));
  iVar2 = (int)in_stack_00000010[2] << (bVar5 & 0x1f);
  extend = *(int *)(in_RDI + 0x10 + (long)(int)uVar1 * 4);
  stride = (uint)in_stack_ffffffffffffff74;
  if (uVar1 != 0) {
    stride = CONCAT13(in_RSI->seq_params->subsampling_x != 0,in_stack_ffffffffffffff74);
  }
  bVar6 = (byte)(stride >> 0x18);
  iVar3 = av1_superres_scaled(in_RSI);
  if (iVar3 != 0) {
    extend = (int)(in_RSI->superres_upscaled_width + (uint)bVar6) >> bVar6;
  }
  iVar3 = extend << (bVar5 & 0x1f);
  for (local_74 = 0; local_74 < 2; local_74 = local_74 + 1) {
    memcpy((void *)(lVar4 + in_R8D * 2 * iVar2 + (long)(local_74 * iVar2)),__src,(long)iVar3);
  }
  extend_lines(buf,(int)((ulong)lVar7 >> 0x20),(int)lVar7,stride,extend,in_stack_ffffffffffffff6c);
  return;
}

Assistant:

static void save_cdef_boundary_lines(const YV12_BUFFER_CONFIG *frame,
                                     const AV1_COMMON *cm, int plane, int row,
                                     int stripe, int use_highbd, int is_above,
                                     RestorationStripeBoundaries *boundaries) {
  const int is_uv = plane > 0;
  const uint8_t *src_buf = REAL_PTR(use_highbd, frame->buffers[plane]);
  const int src_stride = frame->strides[is_uv] << use_highbd;
  const uint8_t *src_rows = src_buf + row * (ptrdiff_t)src_stride;

  uint8_t *bdry_buf = is_above ? boundaries->stripe_boundary_above
                               : boundaries->stripe_boundary_below;
  uint8_t *bdry_start = bdry_buf + (RESTORATION_EXTRA_HORZ << use_highbd);
  const int bdry_stride = boundaries->stripe_boundary_stride << use_highbd;
  uint8_t *bdry_rows = bdry_start + RESTORATION_CTX_VERT * stripe * bdry_stride;
  const int src_width = frame->crop_widths[is_uv];

  // At the point where this function is called, we've already applied
  // superres. So we don't need to extend the lines here, we can just
  // pull directly from the topmost row of the upscaled frame.
  const int ss_x = is_uv && cm->seq_params->subsampling_x;
  const int upscaled_width = av1_superres_scaled(cm)
                                 ? (cm->superres_upscaled_width + ss_x) >> ss_x
                                 : src_width;
  const int line_bytes = upscaled_width << use_highbd;
  for (int i = 0; i < RESTORATION_CTX_VERT; i++) {
    // Copy the line at 'src_rows' into both context lines
    memcpy(bdry_rows + i * bdry_stride, src_rows, line_bytes);
  }
  extend_lines(bdry_rows, upscaled_width, RESTORATION_CTX_VERT, bdry_stride,
               RESTORATION_EXTRA_HORZ, use_highbd);
}